

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  bool bVar3;
  long lVar4;
  Layer *this_00;
  reference pvVar5;
  undefined8 uVar6;
  reference pvVar7;
  reference ppLVar8;
  long *in_RSI;
  long *in_RDI;
  int lr;
  int j_4;
  int j_3;
  int dims;
  Blob *blob_2;
  int j_2;
  int *psh;
  Mat shape_hints;
  int pdlr;
  Blob *blob_1;
  int top_blob_index;
  int j_1;
  Blob *blob;
  int bottom_blob_index;
  int j;
  int custom_index;
  Layer *layer;
  int top_count;
  int bottom_count;
  int typeindex;
  int i;
  ParamDict pd;
  int blob_count;
  int layer_count;
  int magic;
  Mat *in_stack_fffffffffffffd20;
  Layer *in_stack_fffffffffffffd28;
  FILE *in_stack_fffffffffffffd30;
  uint in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  Mat *in_stack_fffffffffffffd40;
  ParamDict *in_stack_fffffffffffffd48;
  NetPrivate *in_stack_fffffffffffffd50;
  Mat *in_stack_fffffffffffffd58;
  int local_220;
  int local_21c;
  Mat local_1d0;
  Mat local_188;
  int local_13c;
  reference local_138;
  int local_12c;
  int *local_128;
  Mat local_120;
  Mat local_d8;
  int local_8c;
  reference local_88;
  int local_80;
  int local_7c;
  reference local_78;
  int local_6c;
  int local_68;
  uint local_64;
  Layer *local_60;
  undefined4 local_58;
  int local_48;
  int local_44;
  uint local_40;
  uint local_3c;
  undefined1 local_38 [20];
  int local_24;
  int local_20;
  int local_1c;
  long *local_18;
  int local_4;
  
  local_1c = 0;
  local_18 = in_RSI;
  lVar4 = (**(code **)(*in_RSI + 0x18))(in_RSI,&local_1c,4);
  if (lVar4 == 4) {
    if (local_1c == 0x7685dd) {
      local_20 = 0;
      local_24 = 0;
      lVar4 = (**(code **)(*local_18 + 0x18))(local_18,&local_20,4);
      if (lVar4 == 4) {
        lVar4 = (**(code **)(*local_18 + 0x18))(local_18,&local_24,4);
        if (lVar4 == 4) {
          if ((local_20 < 1) || (local_24 < 1)) {
            fprintf(_stderr,"invalid layer_count or blob_count");
            fprintf(_stderr,"\n");
            local_4 = -1;
          }
          else {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                       in_stack_fffffffffffffd40,
                       CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)in_stack_fffffffffffffd40,
                       CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
            ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffffd40);
            for (local_3c = 0; (int)local_3c < local_20; local_3c = local_3c + 1) {
              lVar4 = (**(code **)(*local_18 + 0x18))(local_18,&local_40,4);
              if (lVar4 != 4) {
                fprintf(_stderr,"read typeindex failed");
                fprintf(_stderr,"\n");
                local_4 = -1;
                goto LAB_00161c6f;
              }
              lVar4 = (**(code **)(*local_18 + 0x18))(local_18,&local_44,4);
              if (lVar4 != 4) {
                fprintf(_stderr,"read bottom_count failed");
                fprintf(_stderr,"\n");
                local_4 = -1;
                goto LAB_00161c6f;
              }
              lVar4 = (**(code **)(*local_18 + 0x18))(local_18,&local_48,4);
              if (lVar4 != 4) {
                fprintf(_stderr,"read top_count failed");
                fprintf(_stderr,"\n");
                local_4 = -1;
                goto LAB_00161c6f;
              }
              this_00 = create_layer((int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
              local_60 = this_00;
              if (this_00 == (Layer *)0x0) {
                local_64 = local_40 & 0xfffffeff;
                local_60 = (Layer *)(**(code **)(*in_RDI + 0x20))(in_RDI,local_64);
              }
              if (local_60 == (Layer *)0x0) {
                fprintf(_stderr,"layer %d not exists or registered",(ulong)local_40);
                fprintf(_stderr,"\n");
                clear((Net *)this_00);
                local_4 = -1;
                goto LAB_00161c6f;
              }
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd40,
                         CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
              for (local_68 = 0; local_68 < local_44; local_68 = local_68 + 1) {
                lVar4 = (**(code **)(*local_18 + 0x18))(local_18,&local_6c,4);
                if (lVar4 != 4) {
                  fprintf(_stderr,"read bottom_blob_index failed");
                  fprintf(_stderr,"\n");
                  local_4 = -1;
                  goto LAB_00161c6f;
                }
                local_78 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                     ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                      (in_RDI[9] + 8),(long)local_6c);
                iVar1 = local_6c;
                local_78->consumer = local_3c;
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_60->bottoms,(long)local_68);
                *pvVar5 = iVar1;
              }
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd40,
                         CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
              for (local_7c = 0; local_7c < local_48; local_7c = local_7c + 1) {
                lVar4 = (**(code **)(*local_18 + 0x18))(local_18,&local_80,4);
                if (lVar4 != 4) {
                  fprintf(_stderr,"read top_blob_index failed");
                  fprintf(_stderr,"\n");
                  local_4 = -1;
                  goto LAB_00161c6f;
                }
                local_88 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                     ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                      (in_RDI[9] + 8),(long)local_80);
                iVar1 = local_80;
                local_88->producer = local_3c;
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_60->tops,(long)local_7c);
                *pvVar5 = iVar1;
              }
              local_8c = ParamDict::load_param_bin
                                   (in_stack_fffffffffffffd48,
                                    (DataReader *)in_stack_fffffffffffffd40);
              uVar2 = local_3c;
              __stream = _stderr;
              if (local_8c == 0) {
                if ((local_60->support_int8_storage & 1U) != 0) {
                  *(undefined1 *)((long)in_RDI + 0x27) = 0;
                }
                ncnn::Mat::Mat(&local_120);
                ParamDict::get(in_stack_fffffffffffffd48,
                               (int)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                               (Mat *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38))
                ;
                ncnn::Mat::~Mat((Mat *)0x1616bc);
                bVar3 = ncnn::Mat::empty(in_stack_fffffffffffffd20);
                if (!bVar3) {
                  local_128 = ncnn::Mat::operator_cast_to_int_(&local_d8);
                  for (local_12c = 0; local_12c < local_48; local_12c = local_12c + 1) {
                    lVar4 = in_RDI[9];
                    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                       (&local_60->tops,(long)local_12c);
                    local_138 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                          ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                           (lVar4 + 8),(long)*pvVar5);
                    local_13c = *local_128;
                    if (local_13c == 1) {
                      ncnn::Mat::Mat(&local_188,local_128[1],(void *)0x0,4,1,(Allocator *)0x0);
                      ncnn::Mat::operator=
                                ((Mat *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
                      ncnn::Mat::~Mat((Mat *)0x1617d7);
                    }
                    if (local_13c == 2) {
                      ncnn::Mat::Mat(&local_1d0,local_128[1],local_128[2],(void *)0x0,4,1,
                                     (Allocator *)0x0);
                      ncnn::Mat::operator=
                                ((Mat *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
                      ncnn::Mat::~Mat((Mat *)0x1618ab);
                    }
                    if (local_13c == 3) {
                      in_stack_fffffffffffffd20 = (Mat *)0x0;
                      ncnn::Mat::Mat(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,
                                     in_stack_fffffffffffffd38,
                                     (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                                     in_stack_fffffffffffffd28,0,(int)in_stack_fffffffffffffd50,
                                     (Allocator *)in_stack_fffffffffffffd58);
                      ncnn::Mat::operator=
                                ((Mat *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
                      ncnn::Mat::~Mat((Mat *)0x161945);
                    }
                    local_128 = local_128 + 4;
                  }
                }
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           in_stack_fffffffffffffd40,
                           CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
                for (local_21c = 0; local_21c < local_44; local_21c = local_21c + 1) {
                  in_stack_fffffffffffffd50 = (NetPrivate *)(in_RDI[9] + 8);
                  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_60->bottoms,(long)local_21c);
                  pvVar7 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                     ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                      in_stack_fffffffffffffd50,(long)*pvVar5);
                  in_stack_fffffffffffffd58 = &pvVar7->shape;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (&local_60->bottom_shapes,(long)local_21c);
                  ncnn::Mat::operator=((Mat *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
                }
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           in_stack_fffffffffffffd40,
                           CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
                for (local_220 = 0; local_220 < local_48; local_220 = local_220 + 1) {
                  in_stack_fffffffffffffd40 = (Mat *)(in_RDI[9] + 8);
                  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_60->tops,(long)local_220);
                  pvVar7 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                     ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                      in_stack_fffffffffffffd40,(long)*pvVar5);
                  in_stack_fffffffffffffd48 = (ParamDict *)&pvVar7->shape;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (&local_60->top_shapes,(long)local_220);
                  ncnn::Mat::operator=((Mat *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
                }
                in_stack_fffffffffffffd3c = (*local_60->_vptr_Layer[2])(local_60,local_38);
                if (in_stack_fffffffffffffd3c == 0) {
                  in_stack_fffffffffffffd28 = local_60;
                  ppLVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                       (in_RDI[9] + 0x20),(long)(int)local_3c);
                  *ppLVar8 = in_stack_fffffffffffffd28;
                  local_58 = 0;
                }
                else {
                  in_stack_fffffffffffffd30 = _stderr;
                  in_stack_fffffffffffffd38 = local_3c;
                  uVar6 = std::__cxx11::string::c_str();
                  fprintf(in_stack_fffffffffffffd30,"layer load_param %d %s failed",
                          (ulong)in_stack_fffffffffffffd38,uVar6);
                  fprintf(_stderr,"\n");
                  local_58 = 0xe;
                }
                ncnn::Mat::~Mat((Mat *)0x161c10);
              }
              else {
                uVar6 = std::__cxx11::string::c_str();
                fprintf(__stream,"ParamDict load_param %d %s failed",(ulong)uVar2,uVar6);
                fprintf(_stderr,"\n");
              }
            }
            NetPrivate::update_input_output_indexes(in_stack_fffffffffffffd50);
            local_4 = 0;
LAB_00161c6f:
            local_58 = 1;
            ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffffd20);
          }
        }
        else {
          fprintf(_stderr,"read blob_count failed");
          fprintf(_stderr,"\n");
          local_4 = -1;
        }
      }
      else {
        fprintf(_stderr,"read layer_count failed");
        fprintf(_stderr,"\n");
        local_4 = -1;
      }
    }
    else {
      fprintf(_stderr,"param is too old, please regenerate");
      fprintf(_stderr,"\n");
      local_4 = -1;
    }
  }
  else {
    fprintf(_stderr,"read magic failed");
    fprintf(_stderr,"\n");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#define READ_VALUE(buf)                            \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    {                                              \
        NCNN_LOGE("read " #buf " failed");         \
        return -1;                                 \
    }

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize(layer_count);
    d->blobs.resize(blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev) d->vkdev = get_gpu_device();
        if (!d->vkdev) opt.use_vulkan_compute = false; // no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i = 0; i < layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %d not exists or registered", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        //         layer->type = std::string(layer_type);
        //         layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = d->blobs[top_blob_index];

            //             blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("ParamDict load_param %d failed", i);
#endif
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        // pull out top blob shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer load_param %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer load_param %d failed", i);
#endif
            continue;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();

#undef READ_VALUE
    return 0;
}